

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::FunctionalTest::testTransformFeedbackStatus
          (FunctionalTest *this,GLenum parameter_name,GLint expected_value)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  char (*local_1f0) [29];
  char *local_1d0;
  char *local_1c8 [3];
  MessageBuilder local_1b0;
  GLint local_2c;
  long lStack_28;
  GLint value;
  Functions *gl;
  GLint expected_value_local;
  GLenum parameter_name_local;
  FunctionalTest *this_local;
  
  gl._0_4_ = expected_value;
  gl._4_4_ = parameter_name;
  _expected_value_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar1);
  local_2c = 0x4cb2f;
  (*this->m_gl_getTransformFeedbackiv)(this->m_xfb_dsa,gl._4_4_,&local_2c);
  err = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(err,"glGetTransformFeedbackiv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x7af);
  if ((GLint)gl == local_2c) {
    this_local._7_1_ = true;
  }
  else {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1b0,
                        (char (*) [66])
                        "It was expected that glGetTransformFeedbackiv query of parameter ");
    if (gl._4_4_ == 0x8e23) {
      local_1f0 = (char (*) [29])0x2a75204;
    }
    else {
      local_1f0 = (char (*) [29])0x2a75221;
    }
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1f0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [15])" shall return ");
    local_1c8[0] = "mapped_ == GL_FALSE";
    if ((GLint)gl == 1) {
      local_1c8[0] = "mapped_ == GL_TRUE";
    }
    local_1c8[0] = local_1c8[0] + 0xb;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1c8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [10])"however, ");
    local_1d0 = "mapped_ == GL_FALSE";
    if (local_2c == 1) {
      local_1d0 = "mapped_ == GL_TRUE";
    }
    local_1d0 = local_1d0 + 0xb;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1d0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [15])0x2aa0180);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FunctionalTest::testTransformFeedbackStatus(glw::GLenum parameter_name, glw::GLint expected_value)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Dummy storage. */
	glw::GLint value = 314159;

	/* Test of GetTransformFeedbackiv. */
	m_gl_getTransformFeedbackiv(m_xfb_dsa, parameter_name, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTransformFeedbackiv call failed.");

	if (expected_value != value)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "It was expected that glGetTransformFeedbackiv query of parameter "
			<< ((parameter_name == GL_TRANSFORM_FEEDBACK_PAUSED) ? "GL_TRANSFORM_FEEDBACK_PAUSED" :
																   "GL_TRANSFORM_FEEDBACK_ACTIVE")
			<< " shall return " << ((expected_value == GL_TRUE) ? "GL_TRUE" : "GL_FALSE") << "however, "
			<< ((value == GL_TRUE) ? "GL_TRUE" : "GL_FALSE") << " was returned." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}